

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O1

string * __thiscall
ZXing::ToHex_abi_cxx11_(string *__return_storage_ptr__,ZXing *this,ByteArray *bytes)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  string res;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct
            ((ulong)local_50,((char)*(undefined8 *)(this + 8) - (char)*(undefined8 *)this) * '\x03')
  ;
  lVar1 = *(long *)this;
  if (*(long *)(this + 8) != lVar1) {
    lVar3 = 0;
    uVar2 = 0;
    do {
      snprintf((char *)((long)local_50[0] + lVar3),4,"%02X ",(ulong)*(byte *)(lVar1 + uVar2));
      uVar2 = uVar2 + 1;
      lVar1 = *(long *)this;
      lVar3 = lVar3 + 3;
    } while (uVar2 < (ulong)(*(long *)(this + 8) - lVar1));
  }
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_50);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ToHex(const ByteArray& bytes)
{
	std::string res(bytes.size() * 3, ' ');

	for (size_t i = 0; i < bytes.size(); ++i)
	{
#ifdef _MSC_VER
		sprintf_s(&res[i * 3], 4, "%02X ", bytes[i]);
#else
		snprintf(&res[i * 3], 4, "%02X ", bytes[i]);
#endif
	}

	return res.substr(0, res.size()-1);
}